

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices
          (BP3Serializer *this,Comm *comm,BufferSTL *bufferSTL)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  reference pvVar4;
  long *plVar5;
  value_type vVar6;
  long in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  uint64_t pgLength64;
  uint64_t pgCount64;
  vector<char,_std::allocator<char>_> *buffer;
  size_t *position;
  ScopedTimer __var2596;
  int i;
  int rankSource;
  size_t localPosition;
  bool isLittleEndian;
  vector<unsigned_long,_std::allocator<unsigned_long>_> headerInfo;
  size_t serializedPosition;
  vector<char,_std::allocator<char>_> *serialized;
  size_t serializedSize;
  ScopedTimer __var2565;
  size_t extraSize;
  size_t countPosition;
  anon_class_24_3_e2114302 lf_SortMergeIndices;
  anon_class_24_3_6e608e70 lf_DeserializeAllIndices;
  anon_class_16_2_3fe5c9bc lf_DeserializeIndices;
  anon_class_24_3_edd922ae lf_SerializeAllIndices;
  anon_class_8_1_8991fb9c lf_SerializeIndices;
  anon_class_1_0_00000001 lf_IndicesSize;
  ScopedTimer __var2365;
  size_t pgCount;
  int size;
  int rank;
  ScopedTimer __var2357;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *indexPositions;
  size_t *in_stack_fffffffffffffcd8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
  *in_stack_fffffffffffffce0;
  size_t *in_stack_fffffffffffffce8;
  allocator_type *in_stack_fffffffffffffcf0;
  size_type in_stack_fffffffffffffcf8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  size_type __n;
  size_t in_stack_fffffffffffffd08;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  size_t *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  uint in_stack_fffffffffffffd24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
  *in_stack_fffffffffffffd38;
  anon_class_24_3_e2114302 *in_stack_fffffffffffffd40;
  vector<char,_std::allocator<char>_> *serialized_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd70;
  long *in_stack_fffffffffffffd78;
  anon_class_24_3_6e608e70 *in_stack_fffffffffffffd80;
  Comm *in_stack_fffffffffffffd88;
  anon_class_24_3_edd922ae *in_stack_fffffffffffffd90;
  int local_1f8;
  undefined1 local_1e1 [25];
  ulong local_1c8;
  long local_1c0;
  ulong local_1b8;
  int in_stack_fffffffffffffe54;
  size_t *in_stack_fffffffffffffe58;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  Comm *in_stack_fffffffffffffe70;
  undefined1 local_ba [26];
  undefined8 *local_a0;
  undefined1 *local_90;
  undefined1 local_88 [8];
  int *local_80;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 local_60 [15];
  undefined1 local_51 [9];
  undefined8 local_48;
  int local_40;
  int local_3c;
  long local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
       __var357 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                   ::__var357), iVar2 != 0)) {
    uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                ,
                                "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                ,0x165);
    AggregateCollectiveMetadataIndices::__var357 = (void *)ps_timer_create_(uVar3);
    __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                         ::__var357);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_3c = helper::Comm::Rank((Comm *)0xb361b9);
  local_40 = helper::Comm::Size((Comm *)0xb361dd);
  local_48 = 0;
  if (local_3c == 0) {
    if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
         ::__var365 == '\0') &&
       (iVar2 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                     ::__var365), iVar2 != 0)) {
      in_stack_fffffffffffffd90 =
           (anon_class_24_3_edd922ae *)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                               ,
                               "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                               ,0x16d);
      AggregateCollectiveMetadataIndices::__var365 =
           (void *)ps_timer_create_(in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd88 = (Comm *)AggregateCollectiveMetadataIndices::__var365;
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var365);
    }
    external::perfstubs_profiler::ScopedTimer::ScopedTimer
              ((ScopedTimer *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffd80 = (anon_class_24_3_6e608e70 *)(in_RSI + 10);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)
               ((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0xe8));
    std::vector<char,_std::allocator<char>_>::reserve
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd78 = in_RSI + 0xd;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
             *)0xb3630b);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
    ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
            *)0xb36327);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
    ::reserve(in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffd70 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x14);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
             *)0xb36355);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
    ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
            *)0xb36371);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
    ::reserve(in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer
              ((ScopedTimer *)in_stack_fffffffffffffce0);
  }
  local_70 = local_51;
  local_68 = local_60;
  local_80 = &local_40;
  local_a0 = &local_48;
  local_90 = local_88;
  local_ba._2_8_ = local_20;
  local_ba._18_8_ = local_18;
  local_ba[1] = 0;
  serialized_00 = (vector<char,_std::allocator<char>_> *)local_ba;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb364db);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb36504);
  vVar6 = *(value_type *)(local_20 + 0x38);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,0);
  *pvVar4 = vVar6;
  AggregateCollectiveMetadataIndices::anon_class_24_3_edd922ae::operator()
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
  lVar1 = *(long *)(local_20 + 0x30);
  helper::Comm::GathervVectors<char>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
  std::vector<char,_std::allocator<char>_>::reserve
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  if (local_3c == 0) {
    if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
         ::__var565 == '\0') &&
       (iVar2 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                     ::__var565), iVar2 != 0)) {
      in_stack_fffffffffffffd40 =
           (anon_class_24_3_e2114302 *)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                               ,
                               "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                               ,0x235);
      AggregateCollectiveMetadataIndices::__var565 =
           (void *)ps_timer_create_(in_stack_fffffffffffffd40);
      in_stack_fffffffffffffd38 =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
            *)AggregateCollectiveMetadataIndices::__var565;
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var565);
    }
    external::perfstubs_profiler::ScopedTimer::ScopedTimer
              ((ScopedTimer *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_1b8 = *(ulong *)(local_20 + 0x30);
    local_1c0 = local_20 + 0x40;
    local_1c8 = 0;
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb368cd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb368f3);
    helper::IsLittleEndian();
    for (; local_1c8 < local_1b8; local_1c8 = *pvVar4 + 4 + local_1c8) {
      in_stack_fffffffffffffd24 =
           helper::ReadValue<unsigned_int>
                     ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffce0,
                      in_stack_fffffffffffffcd8,false);
      for (local_1f8 = 0; local_1f8 < 4; local_1f8 = local_1f8 + 1) {
        in_stack_fffffffffffffd28 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             helper::ReadValue<unsigned_long>
                       ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffcf0,
                        in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0))
        ;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1e1 + 1)
                            ,(long)local_1f8);
        *pvVar4 = (value_type)in_stack_fffffffffffffd28;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (this_00,in_stack_fffffffffffffd28);
      AggregateCollectiveMetadataIndices::anon_class_24_3_6e608e70::operator()
                (in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 in_stack_fffffffffffffd70,serialized_00,vVar6);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcf0)
      ;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1e1 + 1),0
                         );
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcf0);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer
              ((ScopedTimer *)in_stack_fffffffffffffce0);
  }
  if (local_3c == 0) {
    if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
         ::__var596 == '\0') &&
       (iVar2 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                     ::__var596), iVar2 != 0)) {
      in_stack_fffffffffffffd18 =
           (size_t *)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                               ,
                               "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                               ,0x254);
      AggregateCollectiveMetadataIndices::__var596 =
           (void *)ps_timer_create_(in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd10 =
           (vector<char,_std::allocator<char>_> *)AggregateCollectiveMetadataIndices::__var596;
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var596);
    }
    external::perfstubs_profiler::ScopedTimer::ScopedTimer
              ((ScopedTimer *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    plVar5 = (long *)(local_20 + 0x30);
    *plVar5 = lVar1;
    in_stack_fffffffffffffce0 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
          *)(in_RSI + 10);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffce0);
    __n = 1;
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(unsigned_long *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(unsigned_long *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xb36d82);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffce0);
    helper::CopyToBuffer<char>
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
              );
    vVar6 = *(long *)(local_20 + 0x38) + *plVar5;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,__n);
    *pvVar4 = vVar6;
    AggregateCollectiveMetadataIndices::anon_class_24_3_e2114302::operator()
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    vVar6 = *(long *)(local_20 + 0x38) + *plVar5;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,2);
    *pvVar4 = vVar6;
    AggregateCollectiveMetadataIndices::anon_class_24_3_e2114302::operator()
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer
              ((ScopedTimer *)in_stack_fffffffffffffce0);
  }
  local_ba[1] = 1;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffce0);
  return in_RDI;
}

Assistant:

std::vector<size_t> BP3Serializer::AggregateCollectiveMetadataIndices(helper::Comm const &comm,
                                                                      BufferSTL &bufferSTL)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    int rank = comm.Rank();
    int size = comm.Size();

    // pre-allocate with rank 0 data
    size_t pgCount = 0; //< tracks global PG count
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        // assumes that things are more or less balanced
        m_PGRankIndices.reserve(m_MetadataSet.PGIndex.Buffer.size() * static_cast<size_t>(size));
        m_PGRankIndices.resize(0);

        m_VariableRankIndices.clear();
        m_VariableRankIndices.reserve(m_MetadataSet.VarsIndices.size());

        m_AttributesRankIndices.clear();
        m_AttributesRankIndices.reserve(m_MetadataSet.AttributesIndices.size());
    }

    auto lf_IndicesSize =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices) -> size_t

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        size_t indicesSize = 0;
        for (const auto &indexPair : indices)
        {
            indicesSize += indexPair.second.Buffer.size();
        }
        return indicesSize;
    };

    auto lf_SerializeIndices =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices, size_t &position)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        for (const auto &indexPair : indices)
        {
            const auto &buffer = indexPair.second.Buffer;
            helper::CopyToBuffer(m_SerializedIndices, position, buffer.data(), buffer.size());
        }
    };

    auto lf_SerializeAllIndices = [&](helper::Comm const &comm, const int rank) {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t pgIndicesSize = m_MetadataSet.PGIndex.Buffer.size();
        const size_t variablesIndicesSize = lf_IndicesSize(m_MetadataSet.VarsIndices);
        const size_t attributesIndicesSize = lf_IndicesSize(m_MetadataSet.AttributesIndices);

        // first pre-allocate
        const size_t serializedIndicesSize =
            8 * 4 + pgIndicesSize + variablesIndicesSize + attributesIndicesSize;

        m_SerializedIndices.reserve(serializedIndicesSize + 4);
        m_SerializedIndices.resize(serializedIndicesSize + 4);

        const uint32_t rank32 = static_cast<uint32_t>(rank);
        const uint64_t size64 = static_cast<uint64_t>(serializedIndicesSize);
        const uint64_t variablesIndexOffset = static_cast<uint64_t>(pgIndicesSize + 36);
        const uint64_t attributesIndexOffset =
            static_cast<uint64_t>(pgIndicesSize + 36 + variablesIndicesSize);

        size_t position = 0;
        helper::CopyToBuffer(m_SerializedIndices, position, &rank32);
        helper::CopyToBuffer(m_SerializedIndices, position, &size64);
        helper::CopyToBuffer(m_SerializedIndices, position, &variablesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &attributesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &m_MetadataSet.DataPGCount);

        helper::CopyToBuffer(m_SerializedIndices, position, m_MetadataSet.PGIndex.Buffer.data(),
                             m_MetadataSet.PGIndex.Buffer.size());
        lf_SerializeIndices(m_MetadataSet.VarsIndices, position);
        lf_SerializeIndices(m_MetadataSet.AttributesIndices, position);
    };

    auto lf_DeserializeIndices =
        [&](std::unordered_map<std::string, std::vector<SerialElementIndex>> &deserialized,
            const int rankSource, const std::vector<char> &serialized, const size_t position,
            const size_t endPosition, const bool isRankConstant)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        size_t localPosition = position;
        while (localPosition < endPosition)
        {
            size_t indexPosition = localPosition;
            const ElementIndexHeader header =
                ReadElementIndexHeader(serialized, indexPosition, helper::IsLittleEndian());
            const size_t bufferSize = static_cast<size_t>(header.Length) + 4;

            if (isRankConstant && deserialized.count(header.Name) == 1)
            {
                localPosition += bufferSize;
                continue;
            }
            std::vector<BP3Base::SerialElementIndex> *deserializedIndexes = nullptr;
            auto search = deserialized.find(header.Name);
            if (search == deserialized.end())
            {
                // key (variable name) is not in the map, add it
                // mutex portion
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    deserializedIndexes =
                        &(deserialized
                              .emplace(std::piecewise_construct, std::forward_as_tuple(header.Name),
                                       std::forward_as_tuple(
                                           size, SerialElementIndex(header.MemberID, bufferSize)))
                              .first->second);
                }
            }
            else
            {
                // variable name is already in the map, just get the pointer
                // of the vector of metadata indices
                deserializedIndexes = &(search->second);
            }

            SerialElementIndex &index = deserializedIndexes->at(static_cast<size_t>(rankSource));
            helper::InsertToBuffer(index.Buffer, &serialized[localPosition], bufferSize);
            localPosition += bufferSize;
        }
    };

    auto lf_DeserializeAllIndices = [&](const int rankSource, const std::vector<size_t> headerInfo,
                                        const std::vector<char> &serialized, const size_t position)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t rankIndicesSize = headerInfo[0];
        const size_t variablesIndexOffset = headerInfo[1] + position;
        const size_t attributesIndexOffset = headerInfo[2] + position;
        pgCount += headerInfo[3];
        size_t localPosition = position + 36;

        const size_t pgIndexLength = variablesIndexOffset - localPosition;
        // first deserialize pg indices
        {
            std::lock_guard<std::mutex> lock(m_Mutex);
            helper::InsertToBuffer(m_PGRankIndices, &serialized[localPosition], pgIndexLength);
        }
        // deserialize variable indices
        localPosition = variablesIndexOffset;
        size_t endPosition = attributesIndexOffset;

        lf_DeserializeIndices(m_VariableRankIndices, rankSource, serialized, localPosition,
                              endPosition, false);

        // deserialize attributes indices
        localPosition = attributesIndexOffset;
        endPosition = rankIndicesSize + 4 + position;
        // attributes are constant and unique across ranks
        lf_DeserializeIndices(m_AttributesRankIndices, rankSource, serialized, localPosition,
                              endPosition, true);
    };

    auto lf_SortMergeIndices =
        [&](const std::unordered_map<std::string, std::vector<SerialElementIndex>>
                &deserializedIndices) {
            PERFSTUBS_SCOPED_TIMER_FUNC();
            auto &position = bufferSTL.m_Position;
            auto &buffer = bufferSTL.m_Buffer;

            size_t countPosition = position;

            const uint32_t totalCountU32 = static_cast<uint32_t>(deserializedIndices.size());
            helper::CopyToBuffer(buffer, countPosition, &totalCountU32);
            position += 12; // skip for length

            MergeSerializeIndices(deserializedIndices, comm, bufferSTL);

            // Write length
            const uint64_t totalLengthU64 = static_cast<uint64_t>(position - countPosition - 8);
            helper::CopyToBuffer(buffer, countPosition, &totalLengthU64);
        };

    // BODY of function starts here
    std::vector<size_t> indexPositions(3);
    // pgIndex
    indexPositions[0] = bufferSTL.m_AbsolutePosition;

    lf_SerializeAllIndices(comm, rank); // Set m_SerializedIndices

    size_t countPosition = bufferSTL.m_Position;

    comm.GathervVectors(m_SerializedIndices, bufferSTL.m_Buffer, bufferSTL.m_Position, 0);

    // use bufferSTL (will resize) to GatherV
    const size_t extraSize = 16 + 12 + 12 + m_MetadataSet.MiniFooterSize;

    try
    {
        bufferSTL.m_Buffer.reserve(bufferSTL.m_Position + extraSize); // to avoid power of 2 growth
        bufferSTL.m_Buffer.resize(bufferSTL.m_Position + extraSize);
    }
    catch (...)
    {
        helper::ThrowNested<std::runtime_error>(
            "Toolkit::Format", "bp::bp3::BP3Serializer", "AggregateCollectiveMetadataIndices",
            "buffer overflow when resizing to " + std::to_string(bufferSTL.m_Position + extraSize) +
                " bytes");
    }

    // deserialize, it's all local inside rank 0
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t serializedSize = bufferSTL.m_Position;
        const std::vector<char> &serialized = bufferSTL.m_Buffer;
        size_t serializedPosition = 0;
        std::vector<size_t> headerInfo(4);
        const bool isLittleEndian = helper::IsLittleEndian();

        // if (m_Parameters.Threads == 1)
        {
            while (serializedPosition < serializedSize)
            {
                size_t localPosition = serializedPosition;

                const int rankSource = static_cast<int>(
                    helper::ReadValue<uint32_t>(serialized, localPosition, isLittleEndian));

                for (auto i = 0; i < 4; ++i)
                {
                    headerInfo[i] = static_cast<size_t>(
                        helper::ReadValue<uint64_t>(serialized, localPosition, isLittleEndian));
                }

                lf_DeserializeAllIndices(rankSource, headerInfo, serialized, serializedPosition);
                serializedPosition += headerInfo[0] + 4;
            }
        }
    }

    // now merge (and sort variables and attributes) indices
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        auto &position = bufferSTL.m_Position;
        auto &buffer = bufferSTL.m_Buffer;
        position = countPosition; // back to pg count position

        const uint64_t pgCount64 = static_cast<uint64_t>(pgCount);
        const uint64_t pgLength64 = static_cast<uint64_t>(m_PGRankIndices.size());

        helper::CopyToBuffer(buffer, position, &pgCount64);
        helper::CopyToBuffer(buffer, position, &pgLength64);
        helper::CopyToBuffer(buffer, position, m_PGRankIndices.data(), m_PGRankIndices.size());

        indexPositions[1] = bufferSTL.m_AbsolutePosition + position;
        lf_SortMergeIndices(m_VariableRankIndices);
        indexPositions[2] = bufferSTL.m_AbsolutePosition + position;
        lf_SortMergeIndices(m_AttributesRankIndices);
    }

    return indexPositions;
}